

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.cpp
# Opt level: O0

void __thiscall boost::deflate::detail::adler32_test::run(adler32_test *this)

{
  runner *prVar1;
  uint32_t uVar2;
  runner **pprVar3;
  char local_1f58 [8];
  char large [8000];
  adler32_test *this_local;
  
  pprVar3 = test_suite::detail::current();
  prVar1 = *pprVar3;
  uVar2 = eq(this,"",-1,0xffffffff);
  test_suite::detail::runner::maybe_fail<unsigned_int>
            (prVar1,uVar2,"eq(\"\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/adler32.cpp"
             ,0x1f,"void boost::deflate::detail::adler32_test::run()",(char *)0x0);
  pprVar3 = test_suite::detail::current();
  prVar1 = *pprVar3;
  uVar2 = eq(this,"short",-1,0xffffffff);
  test_suite::detail::runner::maybe_fail<unsigned_int>
            (prVar1,uVar2,"eq(\"short\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/adler32.cpp"
             ,0x20,"void boost::deflate::detail::adler32_test::run()",(char *)0x0);
  pprVar3 = test_suite::detail::current();
  prVar1 = *pprVar3;
  uVar2 = eq(this,"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz_",-1,0xffffffff);
  test_suite::detail::runner::maybe_fail<unsigned_int>
            (prVar1,uVar2,"eq(\"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz_\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/adler32.cpp"
             ,0x21,"void boost::deflate::detail::adler32_test::run()",(char *)0x0);
  pprVar3 = test_suite::detail::current();
  prVar1 = *pprVar3;
  uVar2 = eq(this,
             "Lorem ipsum dolor sit amet, consectetur adipiscing elit. Donec vitae justo orci. Curabitur mattis venenatis tortor, et posuere dolor scelerisque quis. Proin in commodo ipsum. Aenean ullamcorper nibh non convallis rhoncus. Nam auctor, eros eget accumsan mollis, risus nulla commodo sapien, et accumsan eros nisl a leo. Nunc lobortis, nisi et consequat aliquam, justo purus ultrices ligula, non condimentum diam purus vitae tellus. Proin quis ullamcorper magna. Integer scelerisque metus nec justo ultricies ultricies. Sed purus urna, euismod quis nisi nec, porta finibus felis. Duis leo lacus, feugiat et malesuada ac, posuere ut metus. Vivamus dictum leo id semper posuere. Curabitur id nibh vel elit efficitur euismod sed vitae nulla. Proin erat mi, gravida at suscipit non, rhoncus vitae nibh. Maecenas cursus maximus leo eu tristique."
             ,-1,0xffffffff);
  test_suite::detail::runner::maybe_fail<unsigned_int>
            (prVar1,uVar2,
             "eq(\"Lorem ipsum dolor sit amet, consectetur adipiscing elit. Donec vitae justo orci.\" \" Curabitur mattis venenatis tortor, et posuere dolor scelerisque quis. Proin in \" \"commodo ipsum. Aenean ullamcorper nibh non convallis rhoncus. Nam auctor, eros e\" \"get accumsan mollis, risus nulla commodo sapien, et accumsan eros nisl a leo. Nu\" \"nc lobortis, nisi et consequat aliquam, justo purus ultrices ligula, non condime\" \"ntum diam purus vitae tellus. Proin quis ullamcorper magna. Integer scelerisque \" \"metus nec justo ultricies ultricies. Sed purus urna, euismod quis nisi nec, port\" \"a finibus felis. Duis leo lacus, feugiat et malesuada ac, posuere ut metus. Viva\" \"mus dictum leo id semper posuere. Curabitur id nibh vel elit efficitur euismod s\" \"ed vitae nulla. Proin erat mi, gravida at suscipit non, rhoncus vitae nibh. Maec\" \"enas cursus maximus leo eu tristique.\")"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/adler32.cpp"
             ,0x2c,"void boost::deflate::detail::adler32_test::run()",(char *)0x0);
  memset(local_1f58,0,8000);
  local_1f58[0] = -1;
  pprVar3 = test_suite::detail::current();
  prVar1 = *pprVar3;
  uVar2 = eq(this,local_1f58,8000,0xffffffff);
  test_suite::detail::runner::maybe_fail<unsigned_int>
            (prVar1,uVar2,"eq(large, 8000)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/adler32.cpp"
             ,0x2e,"void boost::deflate::detail::adler32_test::run()",(char *)0x0);
  pprVar3 = test_suite::detail::current();
  prVar1 = *pprVar3;
  uVar2 = eq(this,anon_var_dwarf_1113e,-1,0xffffffff);
  test_suite::detail::runner::maybe_fail<unsigned_int>
            (prVar1,uVar2,"eq(\"\\x15\\xb0\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/adler32.cpp"
             ,0x2f,"void boost::deflate::detail::adler32_test::run()",(char *)0x0);
  pprVar3 = test_suite::detail::current();
  prVar1 = *pprVar3;
  uVar2 = eq(this,"\x02",1,0xfff0);
  test_suite::detail::runner::maybe_fail<unsigned_int>
            (prVar1,uVar2,"eq(\"\\x02\", 1, 0xfff0)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/adler32.cpp"
             ,0x30,"void boost::deflate::detail::adler32_test::run()",(char *)0x0);
  return;
}

Assistant:

void run() {

        BOOST_TEST(eq(""));
        BOOST_TEST(eq("short"));
        BOOST_TEST(eq("0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz_"));
        BOOST_TEST(eq("Lorem ipsum dolor sit amet, consectetur adipiscing elit. Donec vitae justo orci." \
                        " Curabitur mattis venenatis tortor, et posuere dolor scelerisque quis. Proin in " \
                        "commodo ipsum. Aenean ullamcorper nibh non convallis rhoncus. Nam auctor, eros e" \
                        "get accumsan mollis, risus nulla commodo sapien, et accumsan eros nisl a leo. Nu" \
                        "nc lobortis, nisi et consequat aliquam, justo purus ultrices ligula, non condime" \
                        "ntum diam purus vitae tellus. Proin quis ullamcorper magna. Integer scelerisque " \
                        "metus nec justo ultricies ultricies. Sed purus urna, euismod quis nisi nec, port" \
                        "a finibus felis. Duis leo lacus, feugiat et malesuada ac, posuere ut metus. Viva" \
                        "mus dictum leo id semper posuere. Curabitur id nibh vel elit efficitur euismod s" \
                        "ed vitae nulla. Proin erat mi, gravida at suscipit non, rhoncus vitae nibh. Maec" \
                        "enas cursus maximus leo eu tristique."));
        const char large[8000] {'\xff'};
        BOOST_TEST(eq(large, 8000));
        BOOST_TEST(eq("\x15\xb0"));
        BOOST_TEST(eq("\x02", 1, 0xfff0));

  }